

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall
dap::Deserializer::deserialize<dap::ExceptionDetails>
          (Deserializer *this,optional<dap::ExceptionDetails> *opt)

{
  bool bVar1;
  ExceptionDetails v;
  ExceptionDetails local_f0;
  
  local_f0.evaluateName.val._M_dataplus._M_p = (pointer)&local_f0.evaluateName.val.field_2;
  local_f0.evaluateName.val._M_string_length = 0;
  local_f0.evaluateName.val.field_2._M_local_buf[0] = '\0';
  local_f0.evaluateName.set = false;
  local_f0.fullTypeName.val._M_dataplus._M_p = (pointer)&local_f0.fullTypeName.val.field_2;
  local_f0.fullTypeName.val._M_string_length = 0;
  local_f0.fullTypeName.val.field_2._M_local_buf[0] = '\0';
  local_f0.fullTypeName.set = false;
  local_f0.innerException.val.
  super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.innerException.val.
  super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.innerException.val.
  super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f0.innerException.val.
  super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f0.innerException._17_8_ = 0;
  local_f0.message.val._M_dataplus._M_p = (pointer)&local_f0.message.val.field_2;
  local_f0.message.val._M_string_length = 0;
  local_f0.message.val.field_2._M_local_buf[0] = '\0';
  local_f0.message.set = false;
  local_f0.stackTrace.val._M_dataplus._M_p = (pointer)&local_f0.stackTrace.val.field_2;
  local_f0.stackTrace.val._M_string_length = 0;
  local_f0.stackTrace.val.field_2._M_local_buf[0] = '\0';
  local_f0.stackTrace.set = false;
  local_f0.typeName.val._M_dataplus._M_p = (pointer)&local_f0.typeName.val.field_2;
  local_f0.typeName.val._M_string_length = 0;
  local_f0.typeName.val.field_2._M_local_buf[0] = '\0';
  local_f0.typeName.set = false;
  bVar1 = deserialize<dap::ExceptionDetails,std::enable_if<true,void>>(this,&local_f0);
  if (bVar1) {
    optional<dap::ExceptionDetails>::operator=(opt,&local_f0);
  }
  ExceptionDetails::~ExceptionDetails(&local_f0);
  return true;
}

Assistant:

bool Serializer::serialize(const dap::array<T>& vec) {
  auto it = vec.begin();
  return array(vec.size(), [&](Serializer* s) { return s->serialize(*it++); });
}